

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparcDisassembler.c
# Opt level: O0

DecodeStatus DecodeReturn(MCInst *MI,uint insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t X;
  DecodeStatus DVar2;
  MCInst *in_RCX;
  uint32_t in_ESI;
  MCInst *in_RDI;
  uint simm13;
  uint rs2;
  uint isImm;
  uint rs1;
  DecodeStatus status;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  uint32_t uVar4;
  uint in_stack_ffffffffffffffd4;
  DecodeStatus local_4;
  
  fieldFromInstruction_4(in_ESI,0xe,5);
  uVar1 = fieldFromInstruction_4(in_ESI,0xd,1);
  uVar4 = 0;
  uVar3 = 0;
  if (uVar1 == 0) {
    uVar4 = fieldFromInstruction_4(in_ESI,0,5);
  }
  else {
    X = fieldFromInstruction_4(in_ESI,0,0xd);
    uVar3 = SignExtend32(X,0xd);
  }
  local_4 = DecodeIntRegsRegisterClass
                      (in_RCX,in_stack_ffffffffffffffd4,CONCAT44(uVar1,uVar4),
                       (void *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
  if (local_4 == MCDisassembler_Success) {
    if (uVar1 == 0) {
      DVar2 = DecodeIntRegsRegisterClass
                        (in_RCX,3,(ulong)uVar4,(void *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
      if (DVar2 != MCDisassembler_Success) {
        return DVar2;
      }
    }
    else {
      MCOperand_CreateImm0(in_RDI,(ulong)uVar3);
    }
    local_4 = MCDisassembler_Success;
  }
  return local_4;
}

Assistant:

static DecodeStatus DecodeReturn(MCInst *MI, unsigned insn, uint64_t Address,
		const void *Decoder)
{
	DecodeStatus status;
	unsigned rs1 = fieldFromInstruction_4(insn, 14, 5);
	unsigned isImm = fieldFromInstruction_4(insn, 13, 1);
	unsigned rs2 = 0;
	unsigned simm13 = 0;
	if (isImm)
		simm13 = SignExtend32(fieldFromInstruction_4(insn, 0, 13), 13);
	else
		rs2 = fieldFromInstruction_4(insn, 0, 5);

	// Decode RS1.
	status = DecodeIntRegsRegisterClass(MI, rs1, Address, Decoder);
	if (status != MCDisassembler_Success)
		return status;

	// Decode RS2 | SIMM13.
	if (isImm)
		MCOperand_CreateImm0(MI, simm13);
	else {
		status = DecodeIntRegsRegisterClass(MI, rs2, Address, Decoder);
		if (status != MCDisassembler_Success)
			return status;
	}

	return MCDisassembler_Success;
}